

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O1

string * __thiscall
VideoHppGenerator::generateEnum
          (string *__return_storage_ptr__,VideoHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>
          *enumData)

{
  size_type *psVar1;
  pointer pcVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer pEVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long lVar10;
  size_type __pos;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer __y;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar13;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string aliasName;
  string strippedValue;
  string enumTemplate;
  string enumValues;
  string prefix;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  valueToNameMap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  size_type *local_f8;
  size_type local_f0;
  size_type local_e8;
  undefined8 uStack_e0;
  string *local_d8;
  pointer local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>
  *local_c8;
  pointer local_c0;
  pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  size_type sVar11;
  
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8 = __return_storage_ptr__;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  toUpperCase(&local_1f8.first,&enumData->first);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1f8.first,"_");
  local_f8 = &local_e8;
  psVar1 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar12 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar12) {
    local_e8 = paVar12->_M_allocated_capacity;
    uStack_e0 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_e8 = paVar12->_M_allocated_capacity;
    local_f8 = psVar1;
  }
  local_f0 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  paVar12 = &local_1f8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.first._M_dataplus._M_p != paVar12) {
    operator_delete(local_1f8.first._M_dataplus._M_p,
                    local_1f8.first.field_2._M_allocated_capacity + 1);
  }
  pEVar5 = (enumData->second).values.
           super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c0 = (enumData->second).values.
             super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = enumData;
  if (pEVar5 != local_c0) {
    paVar9 = &local_278.field_2;
    do {
      paVar8 = &local_298.field_2;
      pcVar2 = (pEVar5->name)._M_dataplus._M_p;
      local_298._M_dataplus._M_p = (pointer)paVar8;
      local_d0 = pEVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar2,pcVar2 + (pEVar5->name)._M_string_length);
      sVar11 = local_f0;
      if ((local_f0 <= local_298._M_string_length) &&
         ((local_f0 == 0 || (iVar3 = bcmp(local_298._M_dataplus._M_p,local_f8,local_f0), iVar3 == 0)
          ))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&local_298,0,sVar11);
      }
      toCamelCase(&local_1f8.first,&local_298,true);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1f8.first,0,0,"e",1);
      pEVar5 = local_d0;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if (paVar7 == paVar6) {
        local_258.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_258.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      }
      else {
        local_258.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_258._M_dataplus._M_p = (pointer)paVar7;
      }
      local_258._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.first._M_dataplus._M_p != paVar12) {
        operator_delete(local_1f8.first._M_dataplus._M_p,
                        local_1f8.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar8) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1f8,&local_258,&pEVar5->name);
      pVar13 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&local_90,&local_1f8);
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assert_fail("valueToNameMap.insert( { valueName, value.name } ).second",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                      ,0xbf,
                      "std::string VideoHppGenerator::generateEnum(const std::pair<std::string, EnumData> &) const"
                     );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.second._M_dataplus._M_p != &local_1f8.second.field_2) {
        operator_delete(local_1f8.second._M_dataplus._M_p,
                        local_1f8.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.first._M_dataplus._M_p != paVar12) {
        operator_delete(local_1f8.first._M_dataplus._M_p,
                        local_1f8.first.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_238,"    ",&local_258);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_238," = ");
      local_278._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar7 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p == paVar7) {
        local_278.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_278.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_278._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_278._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_278,(pEVar5->name)._M_dataplus._M_p,(pEVar5->name)._M_string_length)
      ;
      local_298._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar7 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p == paVar7) {
        local_298.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_298.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_298._M_dataplus._M_p = (pointer)paVar8;
      }
      else {
        local_298.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_298._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_298,",\n");
      local_1f8.first._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar7 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.first._M_dataplus._M_p == paVar7) {
        local_1f8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_1f8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_1f8.first._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        local_1f8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_1f8.first._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_158,local_1f8.first._M_dataplus._M_p,local_1f8.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.first._M_dataplus._M_p != paVar12) {
        operator_delete(local_1f8.first._M_dataplus._M_p,
                        local_1f8.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar8) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar9) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      __y = (pEVar5->aliases).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_b8 = (pEVar5->aliases).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (__y != local_b8) {
        do {
          pcVar2 = (__y->first)._M_dataplus._M_p;
          local_278._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,pcVar2,pcVar2 + (__y->first)._M_string_length);
          sVar11 = local_f0;
          if ((local_f0 <= local_278._M_string_length) &&
             ((local_f0 == 0 ||
              (iVar3 = bcmp(local_278._M_dataplus._M_p,local_f8,local_f0), iVar3 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_278,0,sVar11);
          }
          toCamelCase(&local_1f8.first,&local_278,true);
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_1f8.first,0,0,"e",1);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar7 = &pbVar4->field_2;
          if (paVar8 == paVar7) {
            local_298.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_298.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_298.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_298._M_dataplus._M_p = (pointer)paVar8;
          }
          local_298._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8.first._M_dataplus._M_p != paVar12) {
            operator_delete(local_1f8.first._M_dataplus._M_p,
                            local_1f8.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar9) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_1f8,&local_298,&__y->first);
          pVar13 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                               *)&local_90,&local_1f8);
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            __assert_fail("valueToNameMap.insert( { aliasName, alias.first } ).second",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                          ,0xc5,
                          "std::string VideoHppGenerator::generateEnum(const std::pair<std::string, EnumData> &) const"
                         );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8.second._M_dataplus._M_p != &local_1f8.second.field_2) {
            operator_delete(local_1f8.second._M_dataplus._M_p,
                            local_1f8.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8.first._M_dataplus._M_p != paVar12) {
            operator_delete(local_1f8.first._M_dataplus._M_p,
                            local_1f8.first.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_b0,"    ",&local_298);
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," VULKAN_HPP_DEPRECATED_17( \"");
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar7 = &pbVar4->field_2;
          if (paVar8 == paVar7) {
            local_218.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_218.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_218._M_dataplus._M_p = (pointer)paVar8;
          }
          local_218._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_218,local_298._M_dataplus._M_p,local_298._M_string_length);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar7 = &pbVar4->field_2;
          if (paVar8 == paVar7) {
            local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_138._M_dataplus._M_p = (pointer)paVar8;
          }
          local_138._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_138," is deprecated, ");
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar7 = &pbVar4->field_2;
          if (paVar8 == paVar7) {
            local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_118.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_118._M_dataplus._M_p = (pointer)paVar8;
          }
          local_118._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_118,local_258._M_dataplus._M_p,local_258._M_string_length);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar7 = &pbVar4->field_2;
          if (paVar8 == paVar7) {
            local_178.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_178.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_178._M_dataplus._M_p = (pointer)paVar8;
          }
          local_178._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_178," should be used instead.\" ) = ");
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar7 = &pbVar4->field_2;
          if (paVar8 == paVar7) {
            local_238.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_238.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_238._M_dataplus._M_p = (pointer)paVar8;
          }
          local_238._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_238,(__y->first)._M_dataplus._M_p,(__y->first)._M_string_length)
          ;
          local_278._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
          paVar8 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p == paVar8) {
            local_278.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_278.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_278._M_dataplus._M_p = (pointer)paVar9;
          }
          else {
            local_278.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          }
          local_278._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_278,",\n");
          local_1f8.first._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
          paVar8 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8.first._M_dataplus._M_p == paVar8) {
            local_1f8.first.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_1f8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_1f8.first._M_dataplus._M_p = (pointer)paVar12;
          }
          else {
            local_1f8.first.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          }
          local_1f8.first._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_158,local_1f8.first._M_dataplus._M_p,local_1f8.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8.first._M_dataplus._M_p != paVar12) {
            operator_delete(local_1f8.first._M_dataplus._M_p,
                            local_1f8.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar9) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          __y = __y + 1;
        } while (__y != local_b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      pEVar5 = local_d0 + 1;
    } while (pEVar5 != local_c0);
  }
  sVar11 = local_158._M_string_length;
  if (local_158._M_string_length != 0) {
    do {
      __pos = sVar11 - 1;
      if (sVar11 == 0) {
        __pos = 0xffffffffffffffff;
        break;
      }
      lVar10 = sVar11 - 1;
      sVar11 = __pos;
    } while (local_158._M_dataplus._M_p[lVar10] != ',');
    if (__pos == 0xffffffffffffffff) {
      __assert_fail("pos != std::string::npos",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                    ,0xce,
                    "std::string VideoHppGenerator::generateEnum(const std::pair<std::string, EnumData> &) const"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_158,__pos,1);
    std::operator+(&local_258,"\n",&local_158);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_258,"  ");
    local_1f8.first._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar9 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.first._M_dataplus._M_p == paVar9) {
      local_1f8.first.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_1f8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_1f8.first._M_dataplus._M_p = (pointer)paVar12;
    }
    else {
      local_1f8.first.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_1f8.first._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_158,&local_1f8.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.first._M_dataplus._M_p != paVar12) {
      operator_delete(local_1f8.first._M_dataplus._M_p,
                      local_1f8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"  enum class ${enumName}\n  {${enumValues}};\n","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"StdVideo","");
  pcVar2 = (local_c8->first)._M_dataplus._M_p;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar2,pcVar2 + (local_c8->first)._M_string_length);
  sVar11 = local_278._M_string_length;
  if ((local_278._M_string_length <= local_298._M_string_length) &&
     ((local_278._M_string_length == 0 ||
      (iVar3 = bcmp(local_298._M_dataplus._M_p,local_278._M_dataplus._M_p,local_278._M_string_length
                   ), iVar3 == 0)))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_298,0,sVar11);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1f8,(char (*) [9])"enumName",&local_298);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_1b8,(char (*) [11])"enumValues",&local_158);
  __l._M_len = 2;
  __l._M_array = &local_1f8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_238,(allocator_type *)&local_178);
  replaceWithMap(local_d8,&local_258,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  lVar10 = -0x80;
  paVar12 = &local_1b8.second.field_2;
  do {
    if (paVar12 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar12->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar12->_M_allocated_capacity)[-2],
                      paVar12->_M_allocated_capacity + 1);
    }
    if (&paVar12->_M_allocated_capacity + -4 != (size_type *)(&paVar12->_M_allocated_capacity)[-6])
    {
      operator_delete((size_type *)(&paVar12->_M_allocated_capacity)[-6],
                      (&paVar12->_M_allocated_capacity)[-4] + 1);
    }
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar12->_M_allocated_capacity + -8);
    lVar10 = lVar10 + 0x40;
  } while (lVar10 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  return local_d8;
}

Assistant:

std::string VideoHppGenerator::generateEnum( std::pair<std::string, EnumData> const & enumData ) const
{
  std::string enumValues;
#if !defined( NDEBUG )
  std::map<std::string, std::string> valueToNameMap;
#endif

  // convert the enum name to upper case
  std::string prefix = toUpperCase( enumData.first ) + "_";
  for ( auto const & value : enumData.second.values )
  {
    std::string valueName = "e" + toCamelCase( stripPrefix( value.name, prefix ), true );
    assert( valueToNameMap.insert( { valueName, value.name } ).second );
    enumValues += "    " + valueName + " = " + value.name + ",\n";

    for ( auto const & alias : value.aliases )
    {
      std::string aliasName = "e" + toCamelCase( stripPrefix( alias.first, prefix ), true );
      assert( valueToNameMap.insert( { aliasName, alias.first } ).second );
      enumValues += "    " + aliasName + " VULKAN_HPP_DEPRECATED_17( \"" + aliasName + " is deprecated, " + valueName +
                    " should be used instead.\" ) = " + alias.first + ",\n";
    }
  }

  if ( !enumValues.empty() )
  {
    size_t pos = enumValues.rfind( ',' );
    assert( pos != std::string::npos );
    enumValues.erase( pos, 1 );
    enumValues = "\n" + enumValues + "  ";
  }

  const std::string enumTemplate = R"(  enum class ${enumName}
  {${enumValues}};
)";

  return replaceWithMap( enumTemplate, { { "enumName", stripPrefix( enumData.first, "StdVideo" ) }, { "enumValues", enumValues } } );
}